

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O2

int __thiscall camp::ArrayProperty::remove(ArrayProperty *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  size_t size;
  ForbiddenWrite *pFVar3;
  string *psVar4;
  OutOfRange *__return_storage_ptr__;
  ulong in_RDX;
  allocator local_142;
  allocator local_141;
  string local_140;
  string local_120;
  OutOfRange local_100;
  ForbiddenWrite local_b8;
  ForbiddenWrite local_70;
  
  if (this->m_dynamic == false) {
    pFVar3 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar4 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_70,psVar4);
    std::__cxx11::string::string
              ((string *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_141);
    std::__cxx11::string::string
              ((string *)&local_140,
               "void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",&local_142)
    ;
    Error::prepare<camp::ForbiddenWrite>(pFVar3,&local_70,&local_120,0x8d,&local_140);
    __cxa_throw(pFVar3,&ForbiddenWrite::typeinfo,Error::~Error);
  }
  bVar1 = Property::writable(&this->super_Property,(UserObject *)__filename);
  if (bVar1) {
    size = ArrayProperty::size(this,(UserObject *)__filename);
    if (in_RDX < size) {
      iVar2 = (*(this->super_Property).super_TagHolder._vptr_TagHolder[0xc])(this,__filename);
      return iVar2;
    }
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    OutOfRange::OutOfRange(&local_100,in_RDX,size);
    std::__cxx11::string::string
              ((string *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_141);
    std::__cxx11::string::string
              ((string *)&local_140,
               "void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",&local_142)
    ;
    Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_100,&local_120,0x96,&local_140);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
  }
  pFVar3 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
  psVar4 = Property::name_abi_cxx11_(&this->super_Property);
  ForbiddenWrite::ForbiddenWrite(&local_b8,psVar4);
  std::__cxx11::string::string
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
             ,&local_141);
  std::__cxx11::string::string
            ((string *)&local_140,
             "void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",&local_142);
  Error::prepare<camp::ForbiddenWrite>(pFVar3,&local_b8,&local_120,0x91,&local_140);
  __cxa_throw(pFVar3,&ForbiddenWrite::typeinfo,Error::~Error);
}

Assistant:

void ArrayProperty::remove(const UserObject& object, std::size_t index) const
{
    // Check if the array is dynamic
    if (!dynamic())
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the index is in range
    std::size_t range = size(object);
    if (index >= range)
        CAMP_ERROR(OutOfRange(index, range));

    return removeElement(object, index);
}